

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gz_comp(gz_statep state,int flush)

{
  uInt uVar1;
  uchar *puVar2;
  int iVar3;
  ssize_t sVar4;
  uchar *puVar5;
  int *piVar6;
  char *msg;
  ulong uVar7;
  uint uVar8;
  size_t __n;
  
  if ((state->size == 0) && (iVar3 = gz_init(state), iVar3 == -1)) {
LAB_00747d9f:
    iVar3 = -1;
  }
  else if (state->direct == 0) {
    if (state->reset != 0) {
      if ((state->strm).avail_in == 0) {
        return 0;
      }
      cm_zlib_deflateReset(&state->strm);
      state->reset = 0;
    }
    iVar3 = 0;
    do {
      if ((state->strm).avail_out == 0) {
LAB_00747ccf:
        puVar5 = (state->x).next;
        while (puVar2 = (state->strm).next_out, puVar5 < puVar2) {
          uVar7 = (long)puVar2 - (long)puVar5;
          __n = uVar7 & 0xffffffff;
          if (0x40000000 < (long)uVar7) {
            __n = 0x40000000;
          }
          sVar4 = write(state->fd,puVar5,__n);
          if ((int)(uint)sVar4 < 0) goto LAB_00747d62;
          puVar5 = (state->x).next + ((uint)sVar4 & 0x7fffffff);
          (state->x).next = puVar5;
        }
        if ((state->strm).avail_out == 0) {
          (state->strm).avail_out = state->size;
          puVar5 = state->out;
          (state->strm).next_out = puVar5;
          (state->x).next = puVar5;
        }
      }
      else if ((flush != 0) && (flush != 4 || iVar3 == 1)) goto LAB_00747ccf;
      uVar1 = (state->strm).avail_out;
      iVar3 = cm_zlib_deflate(&state->strm,flush);
      if (iVar3 == -2) {
        cm_zlib_gz_error(state,-2,"internal error: deflate stream corrupt");
        goto LAB_00747d9f;
      }
    } while (uVar1 != (state->strm).avail_out);
    iVar3 = 0;
    if (flush == 4) {
      state->reset = 1;
    }
  }
  else {
    uVar8 = (state->strm).avail_in;
    while (iVar3 = 0, uVar8 != 0) {
      if (0x3fffffff < uVar8) {
        uVar8 = 0x40000000;
      }
      sVar4 = write(state->fd,(state->strm).next_in,(ulong)uVar8);
      uVar8 = (uint)sVar4;
      if ((int)uVar8 < 0) {
LAB_00747d62:
        piVar6 = __errno_location();
        msg = strerror(*piVar6);
        cm_zlib_gz_error(state,-1,msg);
        return -1;
      }
      (state->strm).next_in = (state->strm).next_in + (uVar8 & 0x7fffffff);
      uVar8 = (state->strm).avail_in - uVar8;
      (state->strm).avail_in = uVar8;
    }
  }
  return iVar3;
}

Assistant:

local int gz_comp(state, flush)
    gz_statep state;
    int flush;
{
    int ret, writ;
    unsigned have, put, max = ((unsigned)-1 >> 2) + 1;
    z_streamp strm = &(state->strm);

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return -1;

    /* write directly if requested */
    if (state->direct) {
        while (strm->avail_in) {
            put = strm->avail_in > max ? max : strm->avail_in;
            writ = write(state->fd, strm->next_in, put);
            if (writ < 0) {
                gz_error(state, Z_ERRNO, zstrerror());
                return -1;
            }
            strm->avail_in -= (unsigned)writ;
            strm->next_in += writ;
        }
        return 0;
    }

    /* check for a pending reset */
    if (state->reset) {
        /* don't start a new gzip member unless there is data to write */
        if (strm->avail_in == 0)
            return 0;
        deflateReset(strm);
        state->reset = 0;
    }

    /* run deflate() on provided input until it produces no more output */
    ret = Z_OK;
    do {
        /* write out current buffer contents if full, or if flushing, but if
           doing Z_FINISH then don't write until we get to Z_STREAM_END */
        if (strm->avail_out == 0 || (flush != Z_NO_FLUSH &&
            (flush != Z_FINISH || ret == Z_STREAM_END))) {
            while (strm->next_out > state->x.next) {
                put = strm->next_out - state->x.next > (int)max ? max :
                      (unsigned)(strm->next_out - state->x.next);
                writ = write(state->fd, state->x.next, put);
                if (writ < 0) {
                    gz_error(state, Z_ERRNO, zstrerror());
                    return -1;
                }
                state->x.next += writ;
            }
            if (strm->avail_out == 0) {
                strm->avail_out = state->size;
                strm->next_out = state->out;
                state->x.next = state->out;
            }
        }

        /* compress */
        have = strm->avail_out;
        ret = deflate(strm, flush);
        if (ret == Z_STREAM_ERROR) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: deflate stream corrupt");
            return -1;
        }
        have -= strm->avail_out;
    } while (have);

    /* if that completed a deflate stream, allow another to start */
    if (flush == Z_FINISH)
        state->reset = 1;

    /* all done, no errors */
    return 0;
}